

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  double dVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  REF_INT tet;
  REF_STATUS RVar8;
  double dVar9;
  REF_DBL quality;
  REF_DBL tet_ideal [3];
  REF_INT nodes [27];
  double local_d8;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  *ideal_location = 0.0;
  ideal_location[1] = 0.0;
  ideal_location[2] = 0.0;
  tet = -1;
  uVar7 = 0xffffffff;
  if (-1 < node) {
    pRVar2 = ref_grid->cell[8]->ref_adj;
    uVar7 = 0xffffffff;
    if (node < pRVar2->nnode) {
      uVar7 = (ulong)(uint)pRVar2->first[(uint)node];
    }
  }
  iVar6 = (int)uVar7;
  if (iVar6 != -1) {
    tet = ref_grid->cell[8]->ref_adj->item[iVar6].ref;
  }
  dVar9 = 0.0;
  dVar1 = local_d0;
  while( true ) {
    local_d0 = dVar9;
    if (iVar6 == -1) {
      dVar9 = local_d0 * 1e+20;
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      if (dVar9 <= 1.0) {
        local_d0 = dVar1;
        printf("normalization = %e\n");
        RVar8 = 4;
      }
      else {
        RVar8 = 0;
        lVar5 = 0;
        do {
          ideal_location[lVar5] = ideal_location[lVar5] * (1.0 / local_d0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
      }
      return RVar8;
    }
    uVar4 = ref_smooth_tet_ideal(ref_grid,node,tet,local_c8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x569,"ref_smooth_tet_weighted_ideal",(ulong)uVar4,"tet ideal");
      return uVar4;
    }
    uVar4 = ref_cell_nodes(ref_grid->cell[8],tet,local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x56a,"ref_smooth_tet_weighted_ideal",(ulong)uVar4,"nodes");
      return uVar4;
    }
    uVar4 = ref_node_tet_quality(ref_grid->node,local_a8,&local_d8);
    if (uVar4 != 0) break;
    dVar1 = ref_grid->adapt->smooth_min_quality;
    if (local_d8 <= dVar1) {
      local_d8 = dVar1;
    }
    lVar5 = 0;
    do {
      ideal_location[lVar5] = local_c8[lVar5] * (1.0 / local_d8) + ideal_location[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    pRVar3 = ref_grid->cell[8]->ref_adj->item;
    iVar6 = pRVar3[(int)uVar7].next;
    uVar7 = (ulong)iVar6;
    if (uVar7 == 0xffffffffffffffff) {
      tet = -1;
    }
    else {
      tet = pRVar3[uVar7].ref;
    }
    dVar9 = local_d0 + 1.0 / local_d8;
    dVar1 = local_d0;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x56c,
         "ref_smooth_tet_weighted_ideal",(ulong)uVar4,"tet qual");
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tet_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tet(ref_grid), node, item, cell) {
    RSS(ref_smooth_tet_ideal(ref_grid, node, cell, tet_ideal), "tet ideal");
    RSS(ref_cell_nodes(ref_grid_tet(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tet qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tet_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}